

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

size_t __thiscall Memory::HeapInfo::GetUsedBytes(HeapInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t local_18;
  size_t usedBytes;
  HeapInfo *this_local;
  
  usedBytes = (size_t)this;
  if (((DAT_01eca37e & 1) != 0) &&
     ((this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.usedBytes !=
      0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x87c,"(recyclerPageAllocator.usedBytes == 0)",
                       "recyclerPageAllocator.usedBytes == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_18 = 0;
  ForEachPageAllocator<Memory::HeapInfo::GetUsedBytes()::__0>
            (this,(anon_class_8_1_105b394e)&local_18);
  return local_18;
}

Assistant:

size_t
HeapInfo::GetUsedBytes()
{
#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        Assert(recyclerPageAllocator.usedBytes == 0);
    }
#endif

    size_t usedBytes = 0;
    ForEachPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        usedBytes += pageAlloc->usedBytes;
    });
    return usedBytes;
}